

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O2

void __thiscall TableCommand::TableCommand(TableCommand *this,path *fileName,Encoding encoding)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string sStack_58;
  path fullName;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__TableCommand_001c1be0;
  EncodingTable::EncodingTable(&this->table);
  getFullPathName(&fullName,fileName);
  bVar1 = ghc::filesystem::exists(&fullName);
  if (bVar1) {
    bVar1 = EncodingTable::load(&this->table,&fullName,encoding);
    if (bVar1) goto LAB_00172ae1;
    ghc::filesystem::path::u8string_abi_cxx11_(&sStack_58,fileName);
    Logger::printError<std::__cxx11::string>((Logger *)0x1,0x1822db,(char *)&sStack_58,in_RCX);
  }
  else {
    ghc::filesystem::path::u8string_abi_cxx11_(&sStack_58,fileName);
    Logger::printError<std::__cxx11::string>((Logger *)0x1,0x1822bc,(char *)&sStack_58,in_RCX);
  }
  std::__cxx11::string::~string((string *)&sStack_58);
LAB_00172ae1:
  ghc::filesystem::path::~path(&fullName);
  return;
}

Assistant:

TableCommand::TableCommand(const fs::path& fileName, TextFile::Encoding encoding)
{
	auto fullName = getFullPathName(fileName);

	if (!fs::exists(fullName))
	{
		Logger::printError(Logger::Error, "Table file \"%s\" does not exist", fileName.u8string());
		return;
	}

	if (!table.load(fullName,encoding))
	{
		Logger::printError(Logger::Error, "Invalid table file \"%s\"",fileName.u8string());
		return;
	}
}